

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_uv_area(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *uv_area)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_INT sens;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  
  uVar1 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,uv0,&sens);
  if (uVar1 == 0) {
    uVar1 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,uv1,&sens);
    if (uVar1 == 0) {
      uVar1 = ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,uv2,&sens);
      if (uVar1 == 0) {
        *uv_area = ((uv1[1] - uv2[1]) * (uv0[0] - uv2[0]) - (uv1[0] - uv2[0]) * (uv0[1] - uv2[1])) *
                   0.5;
        return 0;
      }
      pcVar3 = "uv2";
      uVar2 = 0x105;
    }
    else {
      pcVar3 = "uv1";
      uVar2 = 0x103;
    }
  }
  else {
    pcVar3 = "uv0";
    uVar2 = 0x101;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar2,
         "ref_geom_uv_area",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area(REF_GEOM ref_geom, REF_INT *nodes,
                                    REF_DBL *uv_area) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;
  double a, b, c, d;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");
  a = uv0[0] - uv2[0];
  b = uv0[1] - uv2[1];
  c = uv1[0] - uv2[0];
  d = uv1[1] - uv2[1];
  *uv_area = 0.5 * (a * d - b * c);
  return REF_SUCCESS;
}